

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int ParseExpLogAnd(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  bool bVar3;
  aint right;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = ParseExpBitOr(p,(aint *)((long)&local_38 + 4));
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = local_38._4_4_;
    iVar2 = need(p,"&&");
    if (iVar2 != 0) {
      bVar3 = iVar1 != 0;
      do {
        iVar1 = ParseExpBitOr(p,(aint *)&local_38);
        if (iVar1 == 0) {
          return 0;
        }
        bVar3 = (bool)(bVar3 & (int)local_38 != 0);
        iVar1 = need(p,"&&");
      } while (iVar1 != 0);
      iVar1 = -(uint)bVar3;
    }
    *nval = iVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ParseExpLogAnd(char*& p, aint& nval) {
	aint left, right;
	if (!ParseExpBitOr(p, left)) return 0;
	while (need(p, "&&")) {
		if (!ParseExpBitOr(p, right)) return 0;
		left = -(left && right);
	}
	nval = left;
	return 1;
}